

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask13_16(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  vpmovsxbd_avx(ZEXT416(0x241c1008));
  auVar7 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(in[5] * 2)));
  vpmovsxbd_avx(ZEXT416(0x20180c04));
  auVar5 = vpsllvd_avx2(auVar7,_DAT_001aa660);
  auVar8 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)auVar7._8_4_));
  auVar6 = vpsllvd_avx2(auVar8,_DAT_001aa650);
  auVar8 = vpinsrd_avx(ZEXT416(*in),auVar7._0_4_ >> 6,1);
  uVar1 = in[10];
  auVar8 = vpinsrd_avx(auVar8,auVar7._4_4_ >> 0xc | in[5] * 2,2);
  uVar2 = in[0xb];
  auVar8 = vpinsrd_avx(auVar8,auVar7._8_4_ >> 5,3);
  auVar8 = vpternlogd_avx512vl(auVar5,auVar6,auVar8,0xfe);
  *(undefined1 (*) [16])out = auVar8;
  uVar3 = in[0xc];
  uVar4 = in[0xd];
  out[4] = uVar3 << 0x1c | uVar2 << 0xf | uVar1 << 2 | auVar7._12_4_ >> 0xb;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(in + 0xe);
  auVar5 = vpsllvd_avx2(auVar8,_DAT_001aa670);
  auVar8 = vpinsrd_avx(ZEXT416(uVar4 << 9 | uVar3 >> 4),
                       (uint)(*(ulong *)(in + 0xe) >> 10) & 0x3fffff,1);
  auVar8 = vpor_avx(auVar5,auVar8);
  *(long *)(out + 5) = auVar8._0_8_;
  return out + 7;
}

Assistant:

uint32_t *__fastpackwithoutmask13_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (13 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (13 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (13 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (13 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (13 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (13 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;

  return out + 1;
}